

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall imrt::Plan::printSolution(Plan *this)

{
  Plan *in_RDI;
  Station *unaff_retaddr;
  int s;
  Station *st;
  int in_stack_ffffffffffffffdc;
  int local_14;
  Plan *pPVar1;
  
  pPVar1 = in_RDI;
  for (local_14 = 0; local_14 < in_RDI->n_stations; local_14 = local_14 + 1) {
    get_station(in_RDI,in_stack_ffffffffffffffdc);
    Station::printAperture(unaff_retaddr,(int)((ulong)pPVar1 >> 0x20));
  }
  return;
}

Assistant:

void Plan::printSolution () {
    Station *st;
    for (int s=0; s < n_stations; s++) {
      st = get_station(s);
      st->printAperture(s);
    }
  }